

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CShInstruction.cpp
# Opt level: O2

void __thiscall CShInstruction::~CShInstruction(CShInstruction *this)

{
  (this->super_CAssemblerCommand)._vptr_CAssemblerCommand =
       (_func_int **)&PTR__CShInstruction_001c1a80;
  ShRegisterData::~ShRegisterData(&this->registerData);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->immediateData).primary.expression.expression.
              super___shared_ptr<ExpressionInternal,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

CShInstruction::~CShInstruction() = default;